

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
          longdouble delta)

{
  longdouble *plVar1;
  int iVar2;
  bit_array *pbVar3;
  bool bVar4;
  long lVar5;
  longdouble *args_3;
  int variable;
  int i;
  ulong uVar6;
  long lVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int r_size_local;
  int selected_local;
  longdouble local_60;
  int local_54;
  long local_50;
  longdouble local_3c;
  
  local_50 = (long)k * 0x10;
  local_3c = *(longdouble *)(*(long *)(this + 0x78) + local_50);
  args_3 = (longdouble *)(*(long *)(this + 0x78) + local_50);
  local_60 = kappa / ((longdouble)1 - kappa) + delta;
  variable = (int)x;
  r_size_local = r_size;
  selected_local = selected;
  local_54 = k;
  if (selected < 0) {
    plVar1 = *(longdouble **)(this + 0x60);
    *args_3 = *plVar1 * (longdouble)0.5 + local_3c;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    lVar8 = in_ST3;
    lVar9 = in_ST3;
    debug_logger<true>::log<int,int,long_double,long_double>
              ((debug_logger<true> *)this,fmt_00,&selected_local,&r_size_local,plVar1,args_3);
    lVar7 = 0x10;
    for (uVar6 = 0; uVar6 != (uint)r_size_local; uVar6 = uVar6 + 1) {
      iVar2 = *(int *)(*(long *)(this + 0x60) + lVar7);
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
      pbVar3 = *(bit_array **)(this + 0x50);
      *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
           *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - local_60;
      lVar10 = lVar9;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                  *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
      if (in_ST0 <= (longdouble)0) {
        lVar5 = (long)it[iVar2].value * 0x10;
        *(longdouble *)(*(long *)(this + 0x50) + lVar5) =
             (*(longdouble *)(*(long *)(this + 0x50) + lVar5) + in_ST0) - local_60;
      }
      lVar7 = lVar7 + 0x20;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar8;
      lVar8 = lVar9;
      lVar9 = lVar10;
    }
  }
  else {
    lVar7 = *(long *)(this + 0x60);
    lVar8 = *(longdouble *)(lVar7 + (ulong)(uint)selected * 0x20);
    plVar1 = (longdouble *)(lVar7 + (ulong)(uint)selected * 0x20);
    if ((int)(selected + 1U) < r_size) {
      lVar5 = (ulong)(selected + 1U) * 0x20;
      *args_3 = (*(longdouble *)(lVar7 + lVar5) + lVar8) * (longdouble)0.5 + local_3c;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      lVar8 = in_ST3;
      lVar9 = in_ST3;
      debug_logger<true>::log<int,int,long_double,long_double,long_double>
                ((debug_logger<true> *)this,fmt,&selected_local,&r_size_local,plVar1,
                 (longdouble *)(lVar7 + lVar5),args_3);
      lVar7 = 0x10;
      for (uVar6 = 0; (long)uVar6 <= (long)selected_local; uVar6 = uVar6 + 1) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             local_60 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
        lVar10 = lVar9;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if ((longdouble)0 <= in_ST0) {
          lVar5 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar5) =
               local_60 + (*(longdouble *)(*(long *)(this + 0x50) + lVar5) - in_ST0);
        }
        lVar7 = lVar7 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar8;
        lVar8 = lVar9;
        lVar9 = lVar10;
      }
      for (; uVar6 != (uint)r_size_local; uVar6 = uVar6 + 1) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - local_60;
        lVar10 = lVar9;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if (in_ST0 <= (longdouble)0) {
          lVar5 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar5) =
               (*(longdouble *)(*(long *)(this + 0x50) + lVar5) + in_ST0) - local_60;
        }
        lVar7 = lVar7 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar8;
        lVar8 = lVar9;
        lVar9 = lVar10;
      }
    }
    else {
      *args_3 = lVar8 * (longdouble)1.5 + local_3c;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      lVar8 = in_ST3;
      lVar9 = in_ST3;
      debug_logger<true>::log<int,int,long_double,long_double>
                ((debug_logger<true> *)this,fmt_01,&selected_local,&r_size_local,plVar1,args_3);
      lVar7 = 0x10;
      for (uVar6 = 0; uVar6 != (uint)r_size_local; uVar6 = uVar6 + 1) {
        iVar2 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             local_60 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
        lVar10 = lVar9;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if ((longdouble)0 <= in_ST0) {
          lVar5 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar5) =
               local_60 + (*(longdouble *)(*(long *)(this + 0x50) + lVar5) - in_ST0);
        }
        lVar7 = lVar7 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar8;
        lVar8 = lVar9;
        lVar9 = lVar10;
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                      *)this,local_54,x);
  if (bVar4) {
    return (bool)((byte)((byte)((unkuint10)local_3c >> 0x48) ^
                        (byte)((ushort)*(undefined2 *)(*(long *)(this + 0x78) + 8 + local_50) >> 8))
                 >> 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }